

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error-after-write.c
# Opt level: O0

int run_test_tcp_connect_error_after_write(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 auVar3 [16];
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_238;
  int r;
  uv_buf_t buf;
  uv_tcp_t conn;
  uv_write_t write_req;
  sockaddr_in addr;
  uv_connect_t connect_req;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&write_req.bufsml[3].len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x46,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  auVar3 = uv_buf_init("TEST",4);
  buf.base = auVar3._8_8_;
  uStack_238 = auVar3._0_8_;
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,&buf.len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x4a,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_write(&conn.queued_fds,&buf.len,&stack0xfffffffffffffdc8,1,write_cb);
  if ((long)iVar1 != -9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x4d,"r","==","UV_EBADF",(long)iVar1,"==",0xfffffffffffffff7);
    abort();
  }
  iVar1 = uv_tcp_connect(addr.sin_zero,&buf.len,&write_req.bufsml[3].len,connect_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x53,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_write(&conn.queued_fds,&buf.len,&stack0xfffffffffffffdc8,1,write_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x56,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x59,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)connect_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x5b,"1","==","connect_cb_called",1,"==",(long)connect_cb_called);
    abort();
  }
  if ((long)write_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x5c,"1","==","write_cb_called",1,"==",(long)write_cb_called);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x5d,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-connect-error-after-write.c"
            ,0x5f,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_connect_error_after_write) {
#ifdef _WIN32
  RETURN_SKIP("This test is disabled on Windows for now. "
              "See https://github.com/joyent/libuv/issues/444\n");
#else

  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_write_t write_req;
  uv_tcp_t conn;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  buf = uv_buf_init("TEST", 4);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}